

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O2

void duckdb::Node4::DeleteChild(ART *art,Node *node,Node *prefix,uint8_t byte,GateStatus status)

{
  uint8_t byte_00;
  idx_t iVar1;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar2;
  Node child;
  IndexPointer local_38;
  
  pBVar2 = BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::DeleteChildInternal(art,node,byte);
  if (pBVar2->count == '\x01') {
    pBVar2->count = '\0';
    local_38.data = pBVar2->children[0].super_IndexPointer.data;
    byte_00 = pBVar2->key[0];
    iVar1 = (node->super_IndexPointer).data;
    Node::Free(art,node);
    Prefix::Concat(art,prefix,byte_00,(GateStatus)(iVar1 >> 0x3f),(Node *)&local_38,status);
  }
  return;
}

Assistant:

void Node4::DeleteChild(ART &art, Node &node, Node &prefix, const uint8_t byte, const GateStatus status) {
	auto &n = DeleteChildInternal(art, node, byte);

	// Compress one-way nodes.
	if (n.count == 1) {
		n.count--;

		auto child = n.children[0];
		auto remainder = n.key[0];
		auto old_status = node.GetGateStatus();

		Node::Free(art, node);
		Prefix::Concat(art, prefix, remainder, old_status, child, status);
	}
}